

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
avg_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(avg_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  char *pcVar1;
  bool bVar2;
  iterator this_00;
  size_t sVar3;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  array_range_type aVar8;
  value_type vVar9;
  double local_38;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) !=
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar4);
    uVar5 = extraout_RDX;
    goto LAB_00335dcb;
  }
  if (*pcVar1 == '\0') {
    pbVar4 = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8);
  }
  else {
    pbVar4 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
  }
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (&arg0,pbVar4);
  bVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(&arg0);
  if (bVar2) {
    bVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(&arg0);
    if (bVar2) goto LAB_00335db1;
    aVar8 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(&arg0);
    local_38 = 0.0;
    for (this_00 = aVar8.first_._M_current; this_00._M_current != aVar8.last_._M_current._M_current;
        this_00._M_current = this_00._M_current + 1) {
      bVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                        (this_00._M_current);
      if (!bVar2) {
        std::error_code::operator=(in_RCX,invalid_type);
        pbVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                   pbVar4);
        goto LAB_00335dc1;
      }
      dVar6 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                        (this_00._M_current);
      local_38 = local_38 + dVar6;
    }
    sVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size(&arg0);
    auVar7._8_4_ = (int)(sVar3 >> 0x20);
    auVar7._0_8_ = sVar3;
    auVar7._12_4_ = 0x45300000;
    *(undefined2 *)
     &(this->
      super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      )._vptr_function_base = 5;
    (this->
    super_function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)
         (local_38 /
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)));
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
LAB_00335db1:
    pbVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar4);
  }
LAB_00335dc1:
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&arg0);
  uVar5 = extraout_RDX_00;
LAB_00335dcb:
  vVar9.field_0.int64_.val_ = uVar5;
  vVar9.field_0._0_8_ = this;
  return (value_type)vVar9.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            double sum = 0;
            for (auto& j : arg0.array_range())
            {
                if (!j.is_number())
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                sum += j.template as<double>();
            }

            return value_type(sum / static_cast<double>(arg0.size()), semantic_tag::none);
        }